

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.h
# Opt level: O2

string * stringformat<std::vector<unsigned_char,std::allocator<unsigned_char>>const&>
                   (string *__return_storage_ptr__,char *fmt,
                   vector<unsigned_char,_std::allocator<unsigned_char>_> *args)

{
  stringstream buf;
  StringFormatter<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&> local_1b0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  local_1b0.fmt = fmt;
  local_1b0.args.
  super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>.
  super__Head_base<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_false>.
  _M_head_impl = (_Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
                  )(_Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
                    )args;
  StringFormatter<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>::tostream
            (&local_1b0,local_190);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string stringformat(const char *fmt, ARGS&&...args)
{
    std::stringstream buf;
    buf << StringFormatter<ARGS...>(fmt, std::forward<ARGS>(args)...);

    return buf.str();
}